

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_utilization.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  VMEMcache *vc_00;
  undefined8 uVar2;
  int ret;
  VMEMcache *vc;
  test_params p;
  char **argv_local;
  int argc_local;
  
  p._4128_8_ = argv;
  parse_args((test_params *)&vc,argc,argv);
  vc_00 = (VMEMcache *)vmemcache_new();
  vmemcache_set_size(vc_00,vc);
  vmemcache_set_extent_size(vc_00,p.pool_size);
  vmemcache_set_eviction_policy(vc_00,1);
  iVar1 = vmemcache_add(vc_00,&p.val_max);
  if (iVar1 != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_utilization.c"
            ,0x130,"main");
    __stream = _stderr;
    uVar2 = vmemcache_errormsg();
    fprintf(__stream,"vmemcache_new: %s (%s)",uVar2,&p.val_max);
    fprintf(_stderr,"\n");
    abort();
  }
  iVar1 = put_until_timeout(vc_00,(test_params *)&vc);
  vmemcache_delete(vc_00);
  return iVar1;
}

Assistant:

int
main(int argc, char **argv)
{
	test_params p = parse_args(argc, argv);

	VMEMcache *vc = vmemcache_new();
	vmemcache_set_size(vc, p.pool_size);
	vmemcache_set_extent_size(vc, p.extent_size);
	vmemcache_set_eviction_policy(vc, VMEMCACHE_REPLACEMENT_LRU);
	if (vmemcache_add(vc, p.dir))
		UT_FATAL("vmemcache_new: %s (%s)", vmemcache_errormsg(), p.dir);

	int ret = put_until_timeout(vc, &p);

	vmemcache_delete(vc);

	return ret;
}